

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O0

iterator __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::AddNodeReturningIterator
          (ValidPolicyGraph *this,Input policy,
          vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *parent_policies)

{
  Input lhs;
  bool bVar1;
  map<bssl::der::Input,bssl::(anonymous_namespace)::ValidPolicyGraph::Node,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,bssl::(anonymous_namespace)::ValidPolicyGraph::Node>>>
  *this_00;
  type *ptVar2;
  type *ptVar3;
  __enable_if_t<is_constructible<value_type,_pair<Input,_Node>_>::value,_pair<iterator,_bool>_>
  _Var4;
  type *inserted;
  type *iter;
  Node local_c0;
  pair<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node> local_a0;
  pair<std::_Rb_tree_iterator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_bool>
  local_70;
  Span<const_unsigned_char> local_60;
  Span<const_unsigned_char> local_50;
  ValidPolicyGraph *local_40;
  uchar *local_38;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *local_30;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *parent_policies_local;
  ValidPolicyGraph *this_local;
  Input policy_local;
  
  local_38 = (uchar *)policy.data_.size_;
  local_40 = (ValidPolicyGraph *)policy.data_.data_;
  local_30 = parent_policies;
  parent_policies_local = (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)this;
  this_local = local_40;
  policy_local.data_.data_ = local_38;
  Span<unsigned_char_const>::Span<4ul>
            ((Span<unsigned_char_const> *)&local_60,(uchar (*) [4])&kAnyPolicyOid);
  bssl::der::Input::Input((Input *)&local_50,local_60);
  lhs.data_.size_ = (size_t)local_38;
  lhs.data_.data_ = (uchar *)local_40;
  bVar1 = bssl::der::operator!=(lhs,(Input)local_50);
  if (!bVar1) {
    __assert_fail("policy != der::Input(kAnyPolicyOid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                  ,0x2d0,
                  "Level::iterator bssl::(anonymous namespace)::ValidPolicyGraph::AddNodeReturningIterator(der::Input, std::vector<der::Input>)"
                 );
  }
  this_00 = (map<bssl::der::Input,bssl::(anonymous_namespace)::ValidPolicyGraph::Node,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,bssl::(anonymous_namespace)::ValidPolicyGraph::Node>>>
             *)::std::
               vector<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
               ::back(&this->levels_);
  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::vector
            (&local_c0.parent_policies,parent_policies);
  local_c0.mapped = false;
  local_c0.reachable = false;
  ::std::pair<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>::
  pair<bssl::der::Input_&,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_true>
            (&local_a0,(Input *)&this_local,&local_c0);
  _Var4 = ::std::
          map<bssl::der::Input,bssl::(anonymous_namespace)::ValidPolicyGraph::Node,std::less<bssl::der::Input>,std::allocator<std::pair<bssl::der::Input_const,bssl::(anonymous_namespace)::ValidPolicyGraph::Node>>>
          ::insert<std::pair<bssl::der::Input,bssl::(anonymous_namespace)::ValidPolicyGraph::Node>>
                    (this_00,&local_a0);
  local_70.first = _Var4.first._M_node;
  local_70.second = _Var4.second;
  ::std::pair<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>::~pair
            (&local_a0);
  Node::~Node(&local_c0);
  ptVar2 = ::std::
           get<0ul,std::_Rb_tree_iterator<std::pair<bssl::der::Input_const,bssl::(anonymous_namespace)::ValidPolicyGraph::Node>>,bool>
                     (&local_70);
  ptVar3 = ::std::
           get<1ul,std::_Rb_tree_iterator<std::pair<bssl::der::Input_const,bssl::(anonymous_namespace)::ValidPolicyGraph::Node>>,bool>
                     (&local_70);
  if ((*ptVar3 & 1U) != 0) {
    return (iterator)ptVar2->_M_node;
  }
  __assert_fail("inserted",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                ,0x2d6,
                "Level::iterator bssl::(anonymous namespace)::ValidPolicyGraph::AddNodeReturningIterator(der::Input, std::vector<der::Input>)"
               );
}

Assistant:

Level::iterator AddNodeReturningIterator(
      der::Input policy, std::vector<der::Input> parent_policies) {
    assert(policy != der::Input(kAnyPolicyOid));
    auto [iter, inserted] = levels_.back().insert(
        std::pair{policy, Node{std::move(parent_policies)}});
    // GCC before 8.1 tracks individual unused bindings and does not support
    // marking them [[maybe_unused]].
    (void)inserted;
    assert(inserted);
    return iter;
  }